

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_playlist.cpp
# Opt level: O0

FString __thiscall FPlayList::NextLine(FPlayList *this,FILE *file)

{
  char *pcVar1;
  bool bVar2;
  char **local_220;
  char *skipper;
  char buffer [512];
  FILE *file_local;
  FString *str;
  
  buffer._504_8_ = file;
  do {
    pcVar1 = fgets((char *)&skipper,0x200,(FILE *)buffer._504_8_);
    if (pcVar1 == (char *)0x0) {
      FString::FString((FString *)this,"");
      return (FString)(char *)this;
    }
    local_220 = &skipper;
    while( true ) {
      bVar2 = false;
      if (*(char *)local_220 != '\0') {
        bVar2 = *(char *)local_220 < '!';
      }
      if (!bVar2) break;
      local_220 = (char **)((long)local_220 + 1);
    }
    bVar2 = true;
    if (*(char *)local_220 != '#') {
      bVar2 = *(char *)local_220 == '\0';
    }
  } while (bVar2);
  FString::FString((FString *)this,(char *)local_220);
  FString::StripRight((FString *)this,"\r\n");
  FixPathSeperator((FString *)this);
  return (FString)(char *)this;
}

Assistant:

FString FPlayList::NextLine (FILE *file)
{
	char buffer[512];
	char *skipper;

	do
	{
		if (NULL == fgets (buffer, countof(buffer), file))
			return "";

		for (skipper = buffer; *skipper != 0 && *skipper <= ' '; skipper++)
			;
	} while (*skipper == '#' || *skipper == 0);

	FString str(skipper);
	str.StripRight("\r\n");
	FixPathSeperator(str);
	return str;
}